

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O1

void cfl_predict_hbd_32x8_avx2
               (int16_t *pred_buf_q3,uint16_t *dst,int dst_stride,int alpha_q3,int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  undefined1 (*pauVar7) [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 in_ZMM4 [64];
  
  auVar8._0_2_ = (undefined2)alpha_q3;
  auVar8._2_2_ = auVar8._0_2_;
  auVar8._4_2_ = auVar8._0_2_;
  auVar8._6_2_ = auVar8._0_2_;
  auVar8._8_2_ = auVar8._0_2_;
  auVar8._10_2_ = auVar8._0_2_;
  auVar8._12_2_ = auVar8._0_2_;
  auVar8._14_2_ = auVar8._0_2_;
  auVar8._16_2_ = auVar8._0_2_;
  auVar8._18_2_ = auVar8._0_2_;
  auVar8._20_2_ = auVar8._0_2_;
  auVar8._22_2_ = auVar8._0_2_;
  auVar8._24_2_ = auVar8._0_2_;
  auVar8._26_2_ = auVar8._0_2_;
  auVar8._28_2_ = auVar8._0_2_;
  auVar8._30_2_ = auVar8._0_2_;
  auVar2 = vpabsw_avx2(auVar8);
  auVar9 = vpsllw_avx2(auVar2,9);
  auVar2 = *(undefined1 (*) [32])dst;
  auVar3 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar5 = vpsllw_avx2(auVar3,ZEXT416((uint)bd));
  pauVar7 = (undefined1 (*) [32])(dst + 0x10);
  uVar6 = 0xffffffffffffffc0;
  do {
    auVar1 = *(undefined1 (*) [32])((long)pred_buf_q3 + uVar6 + 0x40);
    auVar4 = vpsignw_avx2(auVar8,auVar1);
    auVar1 = vpabsw_avx2(auVar1);
    auVar1 = vpmulhrsw_avx2(auVar1,auVar9);
    auVar1 = vpsignw_avx2(auVar1,auVar4);
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    auVar1 = vpminsw_avx2(auVar1,auVar5 ^ auVar3);
    auVar1 = vpmaxsw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    pauVar7[-1] = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)pred_buf_q3 + uVar6 + 0x60);
    auVar4 = vpsignw_avx2(auVar8,auVar1);
    auVar1 = vpabsw_avx2(auVar1);
    auVar1 = vpmulhrsw_avx2(auVar1,auVar9);
    auVar1 = vpsignw_avx2(auVar1,auVar4);
    auVar1 = vpaddw_avx2(auVar1,auVar2);
    auVar1 = vpminsw_avx2(auVar1,auVar5 ^ auVar3);
    auVar1 = vpmaxsw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    *pauVar7 = auVar1;
    uVar6 = uVar6 + 0x40;
    pauVar7 = (undefined1 (*) [32])(*pauVar7 + (long)dst_stride * 2);
  } while (uVar6 < 0x1c0);
  return;
}

Assistant:

static inline void cfl_predict_hbd_avx2(const int16_t *pred_buf_q3,
                                        uint16_t *dst, int dst_stride,
                                        int alpha_q3, int bd, int width,
                                        int height) {
  // Use SSSE3 version for smaller widths
  assert(width == 16 || width == 32);
  const __m256i alpha_sign = _mm256_set1_epi16(alpha_q3);
  const __m256i alpha_q12 = _mm256_slli_epi16(_mm256_abs_epi16(alpha_sign), 9);
  const __m256i dc_q0 = _mm256_loadu_si256((__m256i *)dst);
  const __m256i max = highbd_max_epi16(bd);

  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    const __m256i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    _mm256_storeu_si256((__m256i *)dst,
                        highbd_clamp_epi16(res, _mm256_setzero_si256(), max));
    if (width == 32) {
      const __m256i res_1 =
          predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      _mm256_storeu_si256(
          (__m256i *)(dst + 16),
          highbd_clamp_epi16(res_1, _mm256_setzero_si256(), max));
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}